

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astArgumentNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_48_6_039ee114 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 6;
  local_20 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_88 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x18) = sVar2;
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_88 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(local_88 + 0x30) != 0) {
    sStack_80 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_88 + 0x30),(context->roots).symbolType,
                           arguments[1]);
    *(sysbvm_tuple_t *)(local_88 + 0x30) = sStack_80;
    _Var1 = sysbvm_astNode_isLiteralNode(context,sStack_80);
    if (_Var1) {
      sStack_70 = sysbvm_astLiteralNode_getValue(sStack_80);
    }
  }
  if (*(sysbvm_tuple_t *)(local_88 + 0x38) != 0) {
    local_78 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_88 + 0x38),(context->roots).typeType,
                          arguments[1]);
    *(sysbvm_tuple_t *)(local_88 + 0x38) = local_78;
    _Var1 = sysbvm_astNode_isLiteralNode(context,local_78);
    if (_Var1) {
      local_68 = sysbvm_astLiteralNode_getValue(local_78);
    }
  }
  if (*(long *)(local_88 + 0x38) == 0) {
    sVar2 = sysbvm_astLiteralNode_create
                      (context,*(sysbvm_tuple_t *)(local_88 + 0x10),(context->roots).anyValueType);
    *(sysbvm_tuple_t *)(local_88 + 0x38) = sVar2;
  }
  if (local_68 == 0) {
    local_68 = (context->roots).anyValueType;
  }
  *(sysbvm_tuple_t *)(local_88 + 0x20) = local_68;
  sStack_60 = sysbvm_analysisEnvironment_setNewSymbolArgumentBinding
                        (context,arguments[1],*(sysbvm_tuple_t *)(local_88 + 0x10),sStack_70,
                         local_68);
  *(sysbvm_tuple_t *)(local_88 + 0x40) = sStack_60;
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_astArgumentNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astArgumentNode_t *argumentNode;
        sysbvm_tuple_t analyzedName;
        sysbvm_tuple_t analyzedType;
        sysbvm_tuple_t evaluatedName;
        sysbvm_tuple_t evaluatedType;
        sysbvm_tuple_t argumentBinding;

    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.argumentNode = (sysbvm_astArgumentNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.argumentNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.argumentNode->super.sourcePosition);

    if(gcFrame.argumentNode->name)
    {
        gcFrame.analyzedName = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode->name, context->roots.symbolType, *environment);
        gcFrame.argumentNode->name = gcFrame.analyzedName;

        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedName))
            gcFrame.evaluatedName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedName);
    }
    if(gcFrame.argumentNode->type)
    {
        gcFrame.analyzedType = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode->type, context->roots.typeType, *environment);
        gcFrame.argumentNode->type = gcFrame.analyzedType;
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedType))
            gcFrame.evaluatedType = sysbvm_astLiteralNode_getValue(gcFrame.analyzedType);
    }

    // TODO: Fetch or attempt to infer the default argument type from a more proper place.
    if(!gcFrame.argumentNode->type)
        gcFrame.argumentNode->type = sysbvm_astLiteralNode_create(context, gcFrame.argumentNode->super.sourcePosition, context->roots.anyValueType);
    if(!gcFrame.evaluatedType)
        gcFrame.evaluatedType = context->roots.anyValueType;
    gcFrame.argumentNode->super.analyzedType = gcFrame.evaluatedType;

    gcFrame.argumentBinding = sysbvm_analysisEnvironment_setNewSymbolArgumentBinding(context, *environment, gcFrame.argumentNode->super.sourcePosition, gcFrame.evaluatedName, gcFrame.evaluatedType);
    gcFrame.argumentNode->binding = gcFrame.argumentBinding;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.argumentNode;
}